

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O2

int h264_transform_size_8x8_flag(bitstream *str,h264_cabac_context *cabac,uint32_t *binVal)

{
  uint32_t uVar1;
  int iVar2;
  h264_macroblock *phVar3;
  
  if (cabac != (h264_cabac_context *)0x0) {
    phVar3 = h264_mb_nb(cabac->slice,H264_MB_A,0);
    uVar1 = phVar3->transform_size_8x8_flag;
    phVar3 = h264_mb_nb(cabac->slice,H264_MB_B,0);
    iVar2 = h264_cabac_decision(str,cabac,uVar1 + phVar3->transform_size_8x8_flag + 399,binVal);
    return iVar2;
  }
  iVar2 = vs_u(str,binVal,1);
  return iVar2;
}

Assistant:

int h264_transform_size_8x8_flag(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *binVal) {
	if (!cabac)
		return vs_u(str, binVal, 1);
	int ctxIdxOffset = H264_CABAC_CTXIDX_TRANSFORM_SIZE_8X8_FLAG, ctxIdxInc;
	int condTermFlagA = h264_mb_nb(cabac->slice, H264_MB_A, 0)->transform_size_8x8_flag;
	int condTermFlagB = h264_mb_nb(cabac->slice, H264_MB_B, 0)->transform_size_8x8_flag;
	ctxIdxInc = condTermFlagA + condTermFlagB;
	return h264_cabac_decision(str, cabac, ctxIdxOffset+ctxIdxInc, binVal);
}